

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_process_file_name.cpp
# Opt level: O0

void __thiscall
ProcessFileName_BufferContentsWithInitialSize_Test::TestBody
          (ProcessFileName_BufferContentsWithInitialSize_Test *this)

{
  bool bVar1;
  char *pcVar2;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lhs;
  initializer_list<char> xs;
  AssertHelper local_1a0;
  Message local_198;
  testing local_18c;
  undefined1 local_18b;
  undefined1 local_18a;
  undefined1 local_189;
  undefined1 local_188;
  undefined1 local_187;
  undefined1 local_186;
  undefined1 local_185;
  undefined1 local_184;
  undefined1 local_183;
  undefined1 local_182;
  undefined1 local_181;
  testing *local_180;
  undefined8 local_178;
  ElementsAreArrayMatcher<char> local_170;
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<char>_> local_158;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_2;
  Message local_128;
  uint local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_1;
  size_t length;
  AssertHelper local_f8;
  Message local_f0 [3];
  size_t local_d8;
  uint local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  small_vector<char,_128UL> buffer;
  ProcessFileName_BufferContentsWithInitialSize_Test *this_local;
  ElementsAreArrayMatcher<char> *matcher;
  
  pstore::small_vector<char,_128UL>::small_vector
            ((small_vector<char,_128UL> *)&gtest_ar.message_,0x80);
  local_cc = 0x80;
  local_d8 = pstore::small_vector<char,_128UL>::capacity
                       ((small_vector<char,_128UL> *)&gtest_ar.message_);
  testing::internal::CmpHelperGE<unsigned_int,unsigned_long>
            ((internal *)local_c8,"128U","buffer.capacity ()",&local_cc,&local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_process_file_name.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f8,local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::Message::~Message(local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  if (bVar1) {
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )pstore::
           process_file_name<unsigned_long(*)(pstore::gsl::span<char,_1l>),pstore::small_vector<char,128ul>>
                     (anon_unknown.dwarf_a79f5::ProcessFileName::get_process_path,
                      (small_vector<char,_128UL> *)&gtest_ar.message_);
    local_11c = 0xc;
    lhs = &gtest_ar_1.message_;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_118,"length","12U",(unsigned_long *)lhs,&local_11c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
    if (!bVar1) {
      testing::Message::Message(&local_128);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
      lhs = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x47;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_process_file_name.cpp"
                 ,0x47,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_128);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
    pstore::small_vector<char,_128UL>::resize((small_vector<char,_128UL> *)&gtest_ar.message_,0xc);
    local_18c = (testing)0x70;
    local_18b = 0x72;
    local_18a = 0x6f;
    local_189 = 99;
    local_188 = 0x65;
    local_187 = 0x73;
    local_186 = 0x73;
    local_185 = 0x20;
    local_184 = 0x70;
    local_183 = 0x61;
    local_182 = 0x74;
    local_181 = 0x68;
    local_180 = &local_18c;
    local_178 = 0xc;
    xs._M_len = (size_type)lhs;
    xs._M_array = (iterator)0xc;
    testing::ElementsAreArray<char>(&local_170,local_180,xs);
    testing::internal::
    MakePredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<char>>
              (&local_158,(internal *)&local_170,matcher);
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<char>>::operator()
              (local_140,(char *)&local_158,(small_vector<char,_128UL> *)0x226d4d);
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<char>_>::
    ~PredicateFormatterFromMatcher(&local_158);
    testing::internal::ElementsAreArrayMatcher<char>::~ElementsAreArrayMatcher(&local_170);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
    if (!bVar1) {
      testing::Message::Message(&local_198);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_process_file_name.cpp"
                 ,0x4b,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
      testing::internal::AssertHelper::~AssertHelper(&local_1a0);
      testing::Message::~Message(&local_198);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  }
  pstore::small_vector<char,_128UL>::~small_vector((small_vector<char,_128UL> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST_F (ProcessFileName, BufferContentsWithInitialSize) {
    pstore::small_vector<char, 128> buffer (std::size_t{128});
    ASSERT_GE (128U, buffer.capacity ());
    std::size_t length = pstore::process_file_name (&get_process_path, buffer);
    EXPECT_EQ (length, 12U);
    buffer.resize (12U); // lose any additional buffer bytes.

    EXPECT_THAT (buffer, ::testing::ElementsAreArray (
                             {'p', 'r', 'o', 'c', 'e', 's', 's', ' ', 'p', 'a', 't', 'h'}));
}